

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwidget.cpp
# Opt level: O2

void __thiscall QOpenGLWidgetPrivate::beginCompose(QOpenGLWidgetPrivate *this)

{
  QOpenGLWidget *this_00;
  
  this_00 = *(QOpenGLWidget **)&this->field_0x8;
  if (this->flushPending == true) {
    this->flushPending = false;
    QOpenGLWidget::makeCurrent(this_00);
    QOpenGLContext::functions();
    QOpenGLExtensions::flushShared();
  }
  this->hasBeenComposed = true;
  QOpenGLWidget::aboutToCompose(this_00);
  return;
}

Assistant:

void QOpenGLWidgetPrivate::beginCompose()
{
    Q_Q(QOpenGLWidget);
    if (flushPending) {
        flushPending = false;
        q->makeCurrent();
        static_cast<QOpenGLExtensions *>(context->functions())->flushShared();
    }
    hasBeenComposed = true;
    emit q->aboutToCompose();
}